

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsymmetricKeyPair.cpp
# Opt level: O0

ByteString * __thiscall AsymmetricKeyPair::serialise(AsymmetricKeyPair *this)

{
  undefined8 *puVar1;
  long *in_RSI;
  ByteString *in_RDI;
  ByteString *in_stack_ffffffffffffff40;
  ByteString *in_stack_ffffffffffffff48;
  ByteString *in_stack_ffffffffffffff68;
  
  puVar1 = (undefined8 *)(**(code **)(*in_RSI + 0x20))();
  (**(code **)*puVar1)();
  ByteString::serialise(in_stack_ffffffffffffff68);
  puVar1 = (undefined8 *)(**(code **)(*in_RSI + 0x30))();
  (**(code **)*puVar1)(&stack0xffffffffffffff40);
  ByteString::serialise(in_stack_ffffffffffffff68);
  operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  ByteString::~ByteString((ByteString *)0x1a44f1);
  ByteString::~ByteString((ByteString *)0x1a44fb);
  ByteString::~ByteString((ByteString *)0x1a4508);
  ByteString::~ByteString((ByteString *)0x1a4515);
  return in_RDI;
}

Assistant:

ByteString AsymmetricKeyPair::serialise() const
{
	return getConstPublicKey()->serialise().serialise() + getConstPrivateKey()->serialise().serialise();
}